

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O3

int coda_mem_cursor_goto_record_field_by_index(coda_cursor_conflict *cursor,long index)

{
  coda_dynamic_type_struct *pcVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  coda_dynamic_type *pcVar4;
  long lVar5;
  
  lVar5 = (long)cursor->n;
  pcVar1 = cursor->stack[lVar5 + -1].type;
  if (pcVar1[1].backend == 2) {
    iVar3 = coda_ascbin_cursor_goto_record_field_by_index(cursor,index);
    return iVar3;
  }
  if (pcVar1[1].backend == coda_backend_ascii) {
    if ((index < 0) || (*(long *)(pcVar1 + 2) <= index)) {
      coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",index);
      iVar3 = -1;
    }
    else {
      cursor->n = cursor->n + 1;
      pcVar2 = *(coda_dynamic_type_struct **)(&(pcVar1[2].definition)->format + index * 2);
      if (pcVar2 == (coda_dynamic_type_struct *)0x0) {
        pcVar4 = coda_no_data_singleton(pcVar1->definition->format);
        lVar5 = (long)cursor->n + -1;
        cursor->stack[(long)cursor->n + -1].type = pcVar4;
      }
      else {
        cursor->stack[lVar5].type = pcVar2;
      }
      cursor->stack[lVar5].index = index;
      cursor->stack[lVar5].bit_offset = -1;
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("type->tag == tag_mem_data",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                ,0x4f,"int coda_mem_cursor_goto_record_field_by_index(coda_cursor *, long)");
}

Assistant:

int coda_mem_cursor_goto_record_field_by_index(coda_cursor *cursor, long index)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_record)
    {
        if (index < 0 || index >= ((coda_mem_record *)type)->num_fields)
        {
            coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                           ((coda_mem_record *)type)->num_fields);
            return -1;
        }
        cursor->n++;
        if (((coda_mem_record *)type)->field_type[index] != NULL)
        {
            cursor->stack[cursor->n - 1].type = ((coda_mem_record *)type)->field_type[index];
        }
        else
        {
            cursor->stack[cursor->n - 1].type = coda_no_data_singleton(type->definition->format);
        }
        cursor->stack[cursor->n - 1].index = index;
        cursor->stack[cursor->n - 1].bit_offset = -1;

        return 0;
    }

    assert(type->tag == tag_mem_data);
    return coda_ascbin_cursor_goto_record_field_by_index(cursor, index);
}